

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  allocator<char> local_29;
  string local_28;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"---------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"nfa0",&local_29);
  create_dfa(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main() {
    cout << "---------------" << endl;
    create_dfa("nfa0");

    /*
    create_dfa("nfa1");
    create_dfa("nfa2");
    create_dfa("nfa3");
    create_dfa("nfa4");
    */
    return 0;
}